

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spirv_cross.cpp
# Opt level: O2

uint32_t __thiscall
diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id
          (PhysicalStorageBufferPointerHandler *this,uint32_t type_id)

{
  bool bVar1;
  SPIRType *pSVar2;
  
  while( true ) {
    pSVar2 = get<diligent_spirv_cross::SPIRType>(this->compiler,type_id);
    if ((*(int *)&(pSVar2->super_IVariant).field_0xc != 0x20) ||
       (pSVar2->storage != PhysicalStorageBuffer)) break;
    bVar1 = type_is_bda_block_entry(this,type_id);
    if (bVar1) break;
    type_id = (pSVar2->parent_type).id;
  }
  bVar1 = type_is_bda_block_entry(this,type_id);
  if (bVar1) {
    return type_id;
  }
  __assert_fail("type_is_bda_block_entry(type_id)",
                "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Cross/spirv_cross.cpp"
                ,0x149b,
                "uint32_t diligent_spirv_cross::Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t) const"
               );
}

Assistant:

uint32_t Compiler::PhysicalStorageBufferPointerHandler::get_base_non_block_type_id(uint32_t type_id) const
{
	auto *type = &compiler.get<SPIRType>(type_id);
	while (compiler.is_physical_pointer(*type) && !type_is_bda_block_entry(type_id))
	{
		type_id = type->parent_type;
		type = &compiler.get<SPIRType>(type_id);
	}

	assert(type_is_bda_block_entry(type_id));
	return type_id;
}